

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O0

Writer * __thiscall JSON::Writer::writeNext(Writer *this)

{
  const_reference pvVar1;
  size_t __n;
  ulong local_18;
  size_t n;
  Writer *this_local;
  
  local_18 = this->indent;
  if ((this->first & 1U) == 0) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&spaces,0);
    __n = 0x32;
    write(this,(int)pvVar1,(void *)(local_18 % 0x32 + 2),0x32);
  }
  else {
    this->first = false;
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&spaces,1);
    __n = 0x32;
    write(this,(int)pvVar1,(void *)(local_18 % 0x32 + 1),0x32);
  }
  for (; 0x31 < local_18; local_18 = local_18 - 0x32) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&spaces,2);
    write(this,(int)pvVar1,(void *)0x32,__n);
  }
  return this;
}

Assistant:

Writer&
    writeNext()
    {
        auto n = indent;
        if (first) {
            first = false;
            write(&spaces[1], n % n_spaces + 1);
        } else {
            write(&spaces[0], n % n_spaces + 2);
        }
        while (n >= n_spaces) {
            write(&spaces[2], n_spaces);
            n -= n_spaces;
        }
        return *this;
    }